

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_test.cc
# Opt level: O3

UniquePtr<BIGNUM> GetBIGNUM(FileTest *t,char *key)

{
  bool bVar1;
  _Head_base<0UL,_bignum_st_*,_false> _Var2;
  tuple<bignum_st_*,_bssl::internal::Deleter> extraout_RAX;
  char *in_RDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  allocator<char> local_59;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  string local_38;
  
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uchar *)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,in_RDX,&local_59);
  bVar1 = FileTest::GetBytes((FileTest *)key,&local_58,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    _Var2._M_head_impl =
         (bignum_st *)
         BN_bin2bn(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (int)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                   (int)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,(BIGNUM *)0x0);
  }
  else {
    _Var2._M_head_impl = (bignum_st *)0x0;
  }
  (t->reader_)._M_t.
  super___uniq_ptr_impl<FileTest::LineReader,_std::default_delete<FileTest::LineReader>_>._M_t.
  super__Tuple_impl<0UL,_FileTest::LineReader_*,_std::default_delete<FileTest::LineReader>_>.
  super__Head_base<0UL,_FileTest::LineReader_*,_false>._M_head_impl =
       (LineReader *)_Var2._M_head_impl;
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    _Var2._M_head_impl =
         (bignum_st *)
         extraout_RAX.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl;
  }
  return (UniquePtr<BIGNUM>)_Var2._M_head_impl;
}

Assistant:

static bssl::UniquePtr<BIGNUM> GetBIGNUM(FileTest *t, const char *key) {
  std::vector<uint8_t> bytes;
  if (!t->GetBytes(&bytes, key)) {
    return nullptr;
  }

  return bssl::UniquePtr<BIGNUM>(BN_bin2bn(bytes.data(), bytes.size(), nullptr));
}